

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

double __thiscall llvm::APInt::roundToDouble(APInt *this,bool isSigned)

{
  uint64_t uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  anon_union_8_2_1313ab2f_for_U __dest;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  anon_union_8_2_1313ab2f_for_U local_58;
  uint local_50;
  double local_48;
  undefined8 uStack_40;
  
  uVar11 = this->BitWidth;
  if ((uVar11 < 0x41) || (uVar6 = countLeadingZerosSlowCase(this), uVar11 - uVar6 < 0x41)) {
    if (0x40 < uVar11) {
      this = (APInt *)(this->U).VAL;
    }
    uVar1 = (this->U).VAL;
    if (isSigned) {
      if (uVar11 == 0) {
        __assert_fail("B > 0 && \"Bit width can\'t be 0.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                      ,0x2f6,"int64_t llvm::SignExtend64(uint64_t, unsigned int)");
      }
      if (0x40 < uVar11) {
        __assert_fail("B <= 64 && \"Bit width out of range.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                      ,0x2f7,"int64_t llvm::SignExtend64(uint64_t, unsigned int)");
      }
      local_48 = (double)((long)(uVar1 << (-(char)uVar11 & 0x3fU)) >> (-(char)uVar11 & 0x3fU));
    }
    else {
      auVar12._8_4_ = (int)(uVar1 >> 0x20);
      auVar12._0_8_ = uVar1;
      auVar12._12_4_ = 0x45300000;
      local_48 = (auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    }
  }
  else {
    if (isSigned) {
      bVar4 = operator[](this,uVar11 - 1);
    }
    else {
      bVar4 = false;
    }
    if (bVar4 == false) {
      uVar10 = (ulong)this->BitWidth;
      if (uVar10 < 0x41) {
        __dest = (anon_union_8_2_1313ab2f_for_U)(this->U).pVal;
      }
      else {
        uVar8 = (ulong)((uint)(uVar10 + 0x3f >> 3) & 0xfffffff8);
        __dest.pVal = (uint64_t *)operator_new__(uVar8);
        memcpy(__dest.pVal,(this->U).pVal,uVar8);
      }
    }
    else {
      local_50 = this->BitWidth;
      if ((ulong)local_50 < 0x41) {
        local_58 = (anon_union_8_2_1313ab2f_for_U)(this->U).pVal;
      }
      else {
        uVar10 = (ulong)((uint)((ulong)local_50 + 0x3f >> 3) & 0xfffffff8);
        local_58.pVal = (uint64_t *)operator_new__(uVar10);
        memcpy(local_58.pVal,(this->U).pVal,uVar10);
      }
      flipAllBits((APInt *)&local_58);
      operator++((APInt *)&local_58);
      uVar10 = (ulong)local_50;
      local_50 = 0;
      __dest = local_58;
    }
    if (((0x40 < local_50 & bVar4) == 1) && ((ulong *)local_58.VAL != (ulong *)0x0)) {
      operator_delete__(local_58.pVal);
    }
    uVar11 = (uint)uVar10;
    if (uVar11 < 0x41) {
      if ((ulong *)__dest.VAL == (ulong *)0x0) {
        uVar6 = 0x40;
      }
      else {
        lVar3 = 0x3f;
        if ((ulong *)__dest.VAL != (ulong *)0x0) {
          for (; __dest.VAL >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar6 = (uint)lVar3 ^ 0x3f;
      }
      iVar7 = (uVar11 - 0x40) + uVar6;
    }
    else {
      uVar8 = uVar10 + 0x3f >> 6;
      iVar7 = 0;
      do {
        if ((long)uVar8 < 1) break;
        uVar2 = ((ulong *)(__dest.VAL - 8))[uVar8];
        if (uVar2 == 0) {
          uVar6 = 0x40;
        }
        else {
          lVar3 = 0x3f;
          if (uVar2 != 0) {
            for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar6 = (uint)lVar3 ^ 0x3f;
        }
        uVar8 = uVar8 - 1;
        iVar7 = iVar7 + uVar6;
      } while (uVar2 == 0);
      uVar6 = uVar11 | 0xffffffc0;
      if ((uVar10 & 0x3f) == 0) {
        uVar6 = uVar11 & 0x3f;
      }
      iVar7 = uVar6 + iVar7;
    }
    uVar6 = uVar11 - iVar7;
    if (uVar6 < 0x400) {
      if (uVar6 - 1 < 0x40) {
        uVar10 = *__dest.pVal;
        if (0x34 < uVar6) {
          uVar10 = uVar10 >> ((byte)uVar6 - 0x34 & 0x3f);
        }
      }
      else {
        uVar9 = uVar6 - 1 >> 6;
        bVar5 = (byte)uVar6 & 0x3f;
        uVar10 = __dest.pVal[uVar9 - 1] >> (bVar5 + 0xb & 0x3f) |
                 __dest.pVal[uVar9] << (0x34 - bVar5 & 0x3f);
      }
      local_48 = (double)((ulong)(uVar6 + 0x3ff) << 0x34 | (ulong)bVar4 << 0x3f | uVar10);
    }
    else {
      local_48 = INFINITY;
      if (isSigned) {
        local_48 = -INFINITY;
      }
      if (bVar4 == false) {
        local_48 = INFINITY;
      }
    }
    if ((0x40 < uVar11) && ((ulong *)__dest.VAL != (ulong *)0x0)) {
      uStack_40 = 0;
      operator_delete__(__dest.pVal);
    }
  }
  return local_48;
}

Assistant:

double APInt::roundToDouble(bool isSigned) const {

  // Handle the simple case where the value is contained in one uint64_t.
  // It is wrong to optimize getWord(0) to VAL; there might be more than one word.
  if (isSingleWord() || getActiveBits() <= APINT_BITS_PER_WORD) {
    if (isSigned) {
      int64_t sext = SignExtend64(getWord(0), BitWidth);
      return double(sext);
    } else
      return double(getWord(0));
  }

  // Determine if the value is negative.
  bool isNeg = isSigned ? (*this)[BitWidth-1] : false;

  // Construct the absolute value if we're negative.
  APInt Tmp(isNeg ? -(*this) : (*this));

  // Figure out how many bits we're using.
  unsigned n = Tmp.getActiveBits();

  // The exponent (without bias normalization) is just the number of bits
  // we are using. Note that the sign bit is gone since we constructed the
  // absolute value.
  uint64_t exp = n;

  // Return infinity for exponent overflow
  if (exp > 1023) {
    if (!isSigned || !isNeg)
      return std::numeric_limits<double>::infinity();
    else
      return -std::numeric_limits<double>::infinity();
  }
  exp += 1023; // Increment for 1023 bias

  // Number of bits in mantissa is 52. To obtain the mantissa value, we must
  // extract the high 52 bits from the correct words in pVal.
  uint64_t mantissa;
  unsigned hiWord = whichWord(n-1);
  if (hiWord == 0) {
    mantissa = Tmp.U.pVal[0];
    if (n > 52)
      mantissa >>= n - 52; // shift down, we want the top 52 bits.
  } else {
    assert(hiWord > 0 && "huh?");
    uint64_t hibits = Tmp.U.pVal[hiWord] << (52 - n % APINT_BITS_PER_WORD);
    uint64_t lobits = Tmp.U.pVal[hiWord-1] >> (11 + n % APINT_BITS_PER_WORD);
    mantissa = hibits | lobits;
  }

  // The leading bit of mantissa is implicit, so get rid of it.
  uint64_t sign = isNeg ? (1ULL << (APINT_BITS_PER_WORD - 1)) : 0;
  union {
    double D;
    uint64_t I;
  } T;
  T.I = sign | (exp << 52) | mantissa;
  return T.D;
}